

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O1

LoopEvent rec_iterl(jit_State *J,BCIns iterins)

{
  uint uVar1;
  byte bVar2;
  
  bVar2 = (byte)(iterins >> 8);
  uVar1 = J->base[bVar2];
  if ((uVar1 & 0x1f000000) != 0) {
    J->base[bVar2 - 1] = uVar1;
    J->maxslot = ((uint)bVar2 + (uint)*(byte *)((long)J->pc + -1)) - 1;
    J->pc = J->pc + ((ulong)(iterins >> 0x10) - 0x7fff);
    return LOOPEV_ENTER;
  }
  J->maxslot = bVar2 - 3;
  J->pc = J->pc + 1;
  return LOOPEV_LEAVE;
}

Assistant:

static LoopEvent rec_iterl(jit_State *J, const BCIns iterins)
{
  BCReg ra = bc_a(iterins);
  lua_assert(J->base[ra] != 0);
  if (!tref_isnil(J->base[ra])) {  /* Looping back? */
    J->base[ra-1] = J->base[ra];  /* Copy result of ITERC to control var. */
    J->maxslot = ra-1+bc_b(J->pc[-1]);
    J->pc += bc_j(iterins)+1;
    return LOOPEV_ENTER;
  } else {
    J->maxslot = ra-3;
    J->pc++;
    return LOOPEV_LEAVE;
  }
}